

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.h
# Opt level: O3

void __thiscall jsonChildren::erase(jsonChildren *this,JSONNode ***position)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  JSONNode **ppJVar3;
  JSONNode **ppJVar4;
  json_index_t jVar5;
  size_type __dnew;
  iteratorKeeper<false> ik;
  json_string local_70;
  size_type local_50;
  iteratorKeeper<false> local_48;
  
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Children is null erase","");
  JSONDebug::_JSON_ASSERT(true,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  ppJVar3 = this->array;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"erasing something from a null array 1","");
  JSONDebug::_JSON_ASSERT(ppJVar3 != (JSONNode **)0x0,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  ppJVar3 = *position;
  ppJVar4 = this->array;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"position is beneath the start of the array 1","");
  JSONDebug::_JSON_ASSERT(ppJVar4 <= ppJVar3,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  ppJVar3 = *position;
  ppJVar4 = this->array;
  uVar2 = this->mysize;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"erasing out of bounds 1","");
  JSONDebug::_JSON_ASSERT(ppJVar3 <= ppJVar4 + uVar2,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  ppJVar3 = *position;
  uVar2 = this->mysize;
  this->mysize = uVar2 - 1;
  memmove(ppJVar3,ppJVar3 + 1,
          (((ulong)~((long)ppJVar3 - (long)this->array) >> 3) + (ulong)uVar2) * 8);
  iteratorKeeper<false>::iteratorKeeper(&local_48,this,position);
  local_50 = 0x17;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  local_70._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_70,(ulong)&local_50);
  local_70.field_2._M_allocated_capacity = local_50;
  builtin_strncpy(local_70._M_dataplus._M_p,"Children is null shrink",0x17);
  local_70._M_string_length = local_50;
  local_70._M_dataplus._M_p[local_50] = '\0';
  JSONDebug::_JSON_ASSERT(true,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  jVar5 = this->mysize;
  if (jVar5 == 0) {
    free(this->array);
    this->array = (JSONNode **)0x0;
    jVar5 = this->mysize;
  }
  this->mycapacity = jVar5;
  iteratorKeeper<false>::~iteratorKeeper(&local_48);
  return;
}

Assistant:

inline void erase(JSONNode ** & position) json_nothrow {
	   JSON_ASSERT(this != 0, JSON_TEXT("Children is null erase"));
	   JSON_ASSERT(array != 0, JSON_TEXT("erasing something from a null array 1"));
	   JSON_ASSERT(position >= array, JSON_TEXT("position is beneath the start of the array 1"));
	   JSON_ASSERT(position <= array + mysize, JSON_TEXT("erasing out of bounds 1"));
	   std::memmove(position, position + 1, (mysize-- - (position - array) - 1) * sizeof(JSONNode *));
	   iteratorKeeper<false> ik(this, position);
	   shrink();
    }